

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LLVMDependenceGraph.cpp
# Opt level: O2

bool __thiscall dg::array_match(dg *this,StringRef name,char **names)

{
  char *__s;
  bool bVar1;
  size_t sVar2;
  uint idx;
  ulong uVar3;
  StringRef RHS;
  StringRef local_30;
  
  local_30.Length = (size_t)name.Data;
  uVar3 = 0;
  local_30.Data = (char *)this;
  do {
    __s = *(char **)(name.Length + uVar3 * 8);
    if (__s == (char *)0x0) break;
    sVar2 = strlen(__s);
    RHS.Length = sVar2;
    RHS.Data = __s;
    bVar1 = llvm::StringRef::equals(&local_30,RHS);
    uVar3 = (ulong)((int)uVar3 + 1);
  } while (!bVar1);
  return __s != (char *)0x0;
}

Assistant:

static bool array_match(llvm::StringRef name, const char *names[]) {
    unsigned idx = 0;
    while (names[idx]) {
        if (name.equals(names[idx]))
            return true;
        ++idx;
    }

    return false;
}